

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition-optimizer.hxx
# Opt level: O2

double __thiscall
lineage::heuristics::
LocalPartitionOptimizer<lineage::heuristics::branching::HungarianBranching<lineage::heuristics::PartitionGraph>,_lineage::heuristics::branching::MaskedHungarianBranching<lineage::heuristics::PartitionGraph>_>
::solveLocalBranchingProblem
          (LocalPartitionOptimizer<lineage::heuristics::branching::HungarianBranching<lineage::heuristics::PartitionGraph>,_lineage::heuristics::branching::MaskedHungarianBranching<lineage::heuristics::PartitionGraph>_>
           *this,size_t partitionIdA,size_t partitionIdB)

{
  double dVar1;
  LocalBranchingOptimizer localBranchingOptimizer;
  MaskedHungarianBranching<lineage::heuristics::PartitionGraph> local_a8;
  
  branching::MaskedHungarianBranching<lineage::heuristics::PartitionGraph>::MaskedHungarianBranching
            (&local_a8,
             &(this->
              super_PartitionOptimizerBase<lineage::heuristics::branching::HungarianBranching<lineage::heuristics::PartitionGraph>_>
              ).partitionGraph_,partitionIdA,partitionIdB,
             ((this->
              super_PartitionOptimizerBase<lineage::heuristics::branching::HungarianBranching<lineage::heuristics::PartitionGraph>_>
              ).super_HeuristicBase.data_)->maxDistance);
  dVar1 = branching::MaskedHungarianBranching<lineage::heuristics::PartitionGraph>::optimize
                    (&local_a8);
  branching::MaskedHungarianBranching<lineage::heuristics::PartitionGraph>::
  ~MaskedHungarianBranching(&local_a8);
  return dVar1;
}

Assistant:

inline double
LocalPartitionOptimizer<BROPT, LBROPT>::solveLocalBranchingProblem(
    size_t partitionIdA, size_t partitionIdB) const
{
    auto localBranchingOptimizer =
        LocalBranchingOptimizer(this->partitionGraph_, partitionIdA,
                                partitionIdB, this->data_.maxDistance);
    return localBranchingOptimizer.optimize();
}